

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O1

void wiener_filter_stripe
               (RestorationUnitInfo *rui,int stripe_width,int stripe_height,int procunit_width,
               uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int32_t *tmpbuf,int bit_depth
               ,aom_internal_error_info *error_info)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  WienerConvolveParams conv_params;
  
  conv_params.round_0 = 3;
  conv_params.round_1 = 0xb;
  if (0 < stripe_width) {
    uVar2 = stripe_width + 0xf;
    lVar3 = 0;
    do {
      uVar1 = uVar2 & 0xfffffff0;
      if (procunit_width <= (int)(uVar2 & 0xfffffff0)) {
        uVar1 = procunit_width;
      }
      (*av1_wiener_convolve_add_src)
                (src + lVar3,(long)src_stride,dst + lVar3,(long)dst_stride,
                 (rui->wiener_info).hfilter,0x10,(rui->wiener_info).vfilter,0x10,uVar1,stripe_height
                 ,&conv_params);
      lVar3 = lVar3 + procunit_width;
      uVar2 = uVar2 - procunit_width;
    } while (lVar3 < (long)(ulong)(uint)stripe_width);
  }
  return;
}

Assistant:

static void wiener_filter_stripe(const RestorationUnitInfo *rui,
                                 int stripe_width, int stripe_height,
                                 int procunit_width, const uint8_t *src,
                                 int src_stride, uint8_t *dst, int dst_stride,
                                 int32_t *tmpbuf, int bit_depth,
                                 struct aom_internal_error_info *error_info) {
  (void)tmpbuf;
  (void)bit_depth;
  (void)error_info;
  assert(bit_depth == 8);
  const WienerConvolveParams conv_params = get_conv_params_wiener(8);

  for (int j = 0; j < stripe_width; j += procunit_width) {
    int w = AOMMIN(procunit_width, (stripe_width - j + 15) & ~15);
    const uint8_t *src_p = src + j;
    uint8_t *dst_p = dst + j;
    av1_wiener_convolve_add_src(
        src_p, src_stride, dst_p, dst_stride, rui->wiener_info.hfilter, 16,
        rui->wiener_info.vfilter, 16, w, stripe_height, &conv_params);
  }
}